

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::RenderInstanceShaders::addStage
          (RenderInstanceShaders *this,DeviceInterface *vki,VkDevice device,
          VkPhysicalDeviceFeatures *deviceFeatures,BinaryCollection *programCollection,char *name,
          VkShaderStageFlagBits stage,Move<vk::Handle<(vk::HandleType)14>_> *outModule)

{
  pointer *ppVVar1;
  iterator __position;
  VkShaderModule obj;
  VkShaderStageFlagBits stage_00;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar2;
  bool bVar3;
  const_iterator cVar4;
  NotSupportedError *this_00;
  long *plVar5;
  size_type *psVar6;
  allocator<char> local_99;
  undefined1 local_98 [32];
  char *local_78;
  VkSpecializationInfo *pVStack_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  VkDevice local_48;
  DeviceInterface *local_40;
  RenderInstanceShaders *local_38;
  
  stage_00 = stage;
  local_40 = vki;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,name,(allocator<char> *)local_68);
  local_48 = device;
  local_38 = this;
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)programCollection,(key_type *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar4._M_node !=
      &(programCollection->m_programs)._M_t._M_impl.super__Rb_tree_header) {
    bVar3 = ::vk::isShaderStageSupported(deviceFeatures,stage_00);
    if (!bVar3) {
      (*local_40->_vptr_DeviceInterface[4])(local_40,local_48);
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<vk::VkShaderStageFlagBits>((string *)local_68,&stage);
      plVar5 = (long *)std::__cxx11::string::append(local_68);
      local_98._0_8_ = *plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_98._0_8_ == psVar6) {
        local_98._16_8_ = *psVar6;
        local_98._24_8_ = plVar5[3];
        local_98._0_8_ = local_98 + 0x10;
      }
      else {
        local_98._16_8_ = *psVar6;
      }
      local_98._8_8_ = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError
                (this_00,(char *)local_98._0_8_,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_98,name,&local_99);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                    *)programCollection,(key_type *)local_98);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)local_68,local_40,local_48,
               *(ProgramBinary **)(cVar4._M_node + 2),0);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    local_98._0_4_ = 0x12;
    local_98._8_8_ = (DeviceInterface *)0x0;
    local_98._16_8_ = (ulong)stage_00 << 0x20;
    local_98._24_8_ = local_68._0_8_;
    local_78 = "main";
    pVStack_70 = (VkSpecializationInfo *)0x0;
    __position._M_current =
         (local_38->m_stageInfos).
         super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_38->m_stageInfos).
        super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo>
                (&local_38->m_stageInfos,__position,(VkPipelineShaderStageCreateInfo *)local_98);
    }
    else {
      (__position._M_current)->pName = "main";
      (__position._M_current)->pSpecializationInfo = (VkSpecializationInfo *)0x0;
      (__position._M_current)->flags = local_98._16_4_;
      (__position._M_current)->stage = local_98._20_4_;
      ((__position._M_current)->module).m_internal = local_68._0_8_;
      *(undefined8 *)__position._M_current = local_98._0_8_;
      (__position._M_current)->pNext = (void *)0x0;
      ppVVar1 = &(local_38->m_stageInfos).
                 super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
    pMVar2 = outModule;
    if ((Move<vk::Handle<(vk::HandleType)14>_> *)local_68 != outModule) {
      local_98._16_8_ = local_58._M_allocated_capacity;
      local_98._24_8_ = local_58._8_8_;
      local_98._0_8_ = local_68._0_8_;
      local_98._8_8_ = local_68._8_8_;
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (DeviceInterface *)0x0;
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = (VkAllocationCallbacks *)0x0;
      obj.m_internal =
           (outModule->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
      if (obj.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&(outModule->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter,obj);
      }
      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
           (VkDevice)local_98._16_8_;
      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)local_98._24_8_;
      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
           local_98._0_8_;
      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
           (DeviceInterface *)local_98._8_8_;
    }
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_68 + 8),
                 (VkShaderModule)local_68._0_8_);
    }
  }
  return;
}

Assistant:

void RenderInstanceShaders::addStage (const vk::DeviceInterface&			vki,
									  vk::VkDevice							device,
									  const vk::VkPhysicalDeviceFeatures&	deviceFeatures,
									  const vk::BinaryCollection&			programCollection,
									  const char*							name,
									  vk::VkShaderStageFlagBits				stage,
									  vk::Move<vk::VkShaderModule>*			outModule)
{
	if (programCollection.contains(name))
	{
		if (vk::isShaderStageSupported(deviceFeatures, stage))
		{
			vk::Move<vk::VkShaderModule>	module	= createShaderModule(vki, device, programCollection.get(name), (vk::VkShaderModuleCreateFlags)0);

			m_stageInfos.push_back(getShaderStageCreateInfo(stage, *module));
			*outModule = module;
		}
		else
		{
			// Wait for the GPU to idle so that throwing the exception
			// below doesn't free in-use GPU resource.
			vki.deviceWaitIdle(device);
			TCU_THROW(NotSupportedError, (de::toString(stage) + " is not supported").c_str());
		}
	}
}